

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

StringTree * __thiscall
capnp::JsonCodec::Impl::encodeRaw
          (StringTree *__return_storage_ptr__,Impl *this,Reader value,uint indent,bool *multiline,
          bool hasPrefix)

{
  char *pcVar1;
  size_t sVar2;
  Branch *pBVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ArrayDisposer *pAVar6;
  StringTree *pSVar7;
  WirePointer *pWVar8;
  int iVar9;
  CappedArray<char,_32UL> *params;
  ArrayPtr<const_char> *params_00;
  FixedArray<char,_1UL> *pFVar10;
  bool bVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  StringPtr chars;
  Reader RVar14;
  StringPtr colon;
  uint subIndent;
  Array<kj::StringTree> encodedElements;
  Reader array;
  undefined1 local_16f;
  undefined1 local_16e;
  undefined1 uStack_16d;
  undefined1 auStack_16c [4];
  StringTree SStack_168;
  undefined1 local_128 [40];
  size_t local_100;
  undefined1 local_f8 [56];
  ArrayDisposer *pAStack_c0;
  ArrayDisposer *pAStack_b8;
  Array<kj::StringTree> local_a8;
  Array<kj::StringTree> local_88;
  ListReader local_68;
  
  params_00 = (ArrayPtr<const_char> *)(ulong)value._reader.dataSize;
  if (value._reader.dataSize < 0x10) {
switchD_002e6314_caseD_0:
    SStack_168.text.content.ptr = (char *)0x4;
    SStack_168.size_ = (size_t)"null";
LAB_002e62c7:
    kj::StringTree::concat<kj::ArrayPtr<char_const>>(__return_storage_ptr__,&SStack_168,params_00);
  }
  else {
    switch(*value._reader.data) {
    case 0:
      goto switchD_002e6314_caseD_0;
    case 1:
      if (value._reader.dataSize == 0x10) {
        bVar11 = false;
      }
      else {
        bVar11 = (bool)(*(byte *)((long)value._reader.data + 2) & 1);
      }
      SStack_168._0_16_ = kj::_::Stringifier::operator*((Stringifier *)&kj::_::STR,bVar11);
      kj::StringTree::concat<kj::StringPtr>(__return_storage_ptr__,(StringPtr *)&SStack_168);
      break;
    case 2:
      uVar12 = 0;
      uVar13 = 0;
      if (0x7f < value._reader.dataSize) {
        uVar12 = (undefined4)*(undefined8 *)((long)value._reader.data + 8);
        uVar13 = (undefined4)((ulong)*(undefined8 *)((long)value._reader.data + 8) >> 0x20);
      }
      kj::_::Stringifier::operator*
                ((CappedArray<char,_32UL> *)&SStack_168,(Stringifier *)&kj::_::STR,
                 (double)CONCAT44(uVar13,uVar12));
      kj::StringTree::concat<kj::CappedArray<char,32ul>>(__return_storage_ptr__,&SStack_168,params);
      break;
    case 3:
      if (value._reader.pointerCount == 0) {
        value._reader.pointers = (WirePointer *)0x0;
        value._reader.nestingLimit = 0x7fffffff;
      }
      SStack_168.size_._0_4_ = 0;
      SStack_168.size_._4_4_ = 0;
      SStack_168.text.content.ptr._0_4_ = 0;
      SStack_168.text.content.ptr._4_4_ = 0;
      if (value._reader.pointerCount != 0) {
        SStack_168.size_._0_4_ = value._reader.segment._0_4_;
        SStack_168.size_._4_4_ = value._reader.segment._4_4_;
        SStack_168.text.content.ptr._0_4_ = value._reader.capTable._0_4_;
        SStack_168.text.content.ptr._4_4_ = value._reader.capTable._4_4_;
      }
      SStack_168.text.content.disposer =
           (ArrayDisposer *)
           CONCAT44(SStack_168.text.content.disposer._4_4_,value._reader.nestingLimit);
      SStack_168.text.content.size_ = (size_t)value._reader.pointers;
      chars.content =
           (ArrayPtr<const_char>)
           capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&SStack_168,(void *)0x0,0)
      ;
      encodeString((String *)&SStack_168,this,chars);
      pWVar8 = (WirePointer *)(SStack_168.text.content.ptr + -1);
      if (SStack_168.text.content.ptr == (char *)0x0) {
        pWVar8 = (WirePointer *)0x0;
      }
      __return_storage_ptr__->size_ = (size_t)pWVar8;
      (__return_storage_ptr__->text).content.ptr = (char *)SStack_168.size_;
      (__return_storage_ptr__->text).content.size_ = (size_t)SStack_168.text.content.ptr;
      (__return_storage_ptr__->text).content.disposer =
           (ArrayDisposer *)SStack_168.text.content.size_;
      (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
      (__return_storage_ptr__->branches).size_ = 0;
      (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
      break;
    case 4:
      if (value._reader.pointerCount == 0) {
        value._reader.pointers = (WirePointer *)0x0;
        value._reader.nestingLimit = 0x7fffffff;
      }
      SStack_168.size_._0_4_ = 0;
      SStack_168.size_._4_4_ = 0;
      SStack_168.text.content.ptr._0_4_ = 0;
      SStack_168.text.content.ptr._4_4_ = 0;
      if (value._reader.pointerCount != 0) {
        SStack_168.size_._0_4_ = value._reader.segment._0_4_;
        SStack_168.size_._4_4_ = value._reader.segment._4_4_;
        SStack_168.text.content.ptr._0_4_ = value._reader.capTable._0_4_;
        SStack_168.text.content.ptr._4_4_ = value._reader.capTable._4_4_;
      }
      SStack_168.text.content.disposer =
           (ArrayDisposer *)
           CONCAT44(SStack_168.text.content.disposer._4_4_,value._reader.nestingLimit);
      SStack_168.text.content.size_ = (size_t)value._reader.pointers;
      capnp::_::PointerReader::getList
                (&local_68,(PointerReader *)&SStack_168,INLINE_COMPOSITE,(word *)0x0);
      local_128._0_8_ = &local_68;
      local_128._32_4_ = (indent + 1) - (uint)(local_68.elementCount < 2);
      SStack_168.text.content.size_ = (size_t)&local_16f;
      local_16f = false;
      SStack_168.text.content.ptr = local_128 + 0x20;
      SStack_168.size_ = (size_t)this;
      kj::_::Mapper<capnp::List<capnp::json::Value,_(capnp::Kind)3>::Reader_&>::
      operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_json_c__:62:32)>
                ((Array<kj::StringTree> *)local_f8,
                 (Mapper<capnp::List<capnp::json::Value,_(capnp::Kind)3>::Reader_&> *)local_128,
                 (anon_class_24_3_b5b61ab8 *)&SStack_168);
      local_88.ptr = (StringTree *)local_f8._0_8_;
      local_88.size_ = local_f8._8_8_;
      local_88.disposer = (ArrayDisposer *)local_f8._16_8_;
      local_f8._0_8_ = (StringTree *)0x0;
      local_f8._8_8_ = 0;
      pFVar10 = (FixedArray<char,_1UL> *)(ulong)indent;
      encodeList(&SStack_168,this,&local_88,(bool)local_16f,indent,multiline,hasPrefix);
      local_128[0] = 0x5b;
      auStack_16c[0] = 0x5d;
      kj::StringTree::concat<kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
                (__return_storage_ptr__,(StringTree *)local_128,(FixedArray<char,_1UL> *)&SStack_168
                 ,(StringTree *)auStack_16c,pFVar10);
      sVar2 = SStack_168.branches.size_;
      pBVar3 = SStack_168.branches.ptr;
      if (SStack_168.branches.ptr != (Branch *)0x0) {
        SStack_168.branches.ptr = (Branch *)0x0;
        SStack_168.branches.size_ = 0;
        (**(SStack_168.branches.disposer)->_vptr_ArrayDisposer)
                  (SStack_168.branches.disposer,pBVar3,0x40,sVar2,sVar2,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
      }
      sVar2 = SStack_168.text.content.size_;
      pcVar1 = SStack_168.text.content.ptr;
      if (SStack_168.text.content.ptr != (char *)0x0) {
        SStack_168.text.content.ptr = (char *)0x0;
        SStack_168.text.content.size_ = 0;
        (**(SStack_168.text.content.disposer)->_vptr_ArrayDisposer)
                  (SStack_168.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
      }
      sVar2 = local_88.size_;
      pSVar7 = local_88.ptr;
      if (local_88.ptr != (StringTree *)0x0) {
        local_88.ptr = (StringTree *)0x0;
        local_88.size_ = 0;
        (**(local_88.disposer)->_vptr_ArrayDisposer)
                  (local_88.disposer,pSVar7,0x38,sVar2,sVar2,
                   kj::ArrayDisposer::Dispose_<kj::StringTree>::destruct);
      }
      uVar5 = local_f8._8_8_;
      uVar4 = local_f8._0_8_;
      if ((StringTree *)local_f8._0_8_ != (StringTree *)0x0) {
        local_f8._0_8_ = (StringTree *)0x0;
        local_f8._8_8_ = 0;
        (***(_func_int ***)local_f8._16_8_)
                  (local_f8._16_8_,uVar4,0x38,uVar5,uVar5,
                   kj::ArrayDisposer::Dispose_<kj::StringTree>::destruct);
      }
      break;
    case 5:
      if (value._reader.pointerCount == 0) {
        value._reader.pointers = (WirePointer *)0x0;
        value._reader.nestingLimit = 0x7fffffff;
      }
      SStack_168.size_._0_4_ = 0;
      SStack_168.size_._4_4_ = 0;
      SStack_168.text.content.ptr._0_4_ = 0;
      SStack_168.text.content.ptr._4_4_ = 0;
      if (value._reader.pointerCount != 0) {
        SStack_168.size_._0_4_ = value._reader.segment._0_4_;
        SStack_168.size_._4_4_ = value._reader.segment._4_4_;
        SStack_168.text.content.ptr._0_4_ = value._reader.capTable._0_4_;
        SStack_168.text.content.ptr._4_4_ = value._reader.capTable._4_4_;
      }
      SStack_168.text.content.disposer =
           (ArrayDisposer *)
           CONCAT44(SStack_168.text.content.disposer._4_4_,value._reader.nestingLimit);
      SStack_168.text.content.size_ = (size_t)value._reader.pointers;
      capnp::_::PointerReader::getList
                (&local_68,(PointerReader *)&SStack_168,INLINE_COMPOSITE,(word *)0x0);
      local_128._32_8_ = &local_68;
      auStack_16c = (undefined1  [4])((indent + 1) - (uint)(local_68.elementCount < 2));
      SStack_168.text.content.size_ = (size_t)auStack_16c;
      SStack_168.text.content.disposer = (ArrayDisposer *)&local_16e;
      local_16e = false;
      local_128._0_8_ = ":";
      if ((ulong)this->prettyPrint != 0) {
        local_128._0_8_ = ": ";
      }
      local_128._8_8_ = (ulong)this->prettyPrint | 2;
      SStack_168.text.content.ptr = local_128;
      SStack_168.size_ = (size_t)this;
      kj::_::Mapper<capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader_&>::
      operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_json_c__:75:32)>
                ((Array<kj::StringTree> *)local_f8,
                 (Mapper<capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader_&> *)
                 (local_128 + 0x20),(anon_class_32_4_977eede9 *)&SStack_168);
      local_a8.ptr = (StringTree *)local_f8._0_8_;
      local_a8.size_ = local_f8._8_8_;
      local_a8.disposer = (ArrayDisposer *)local_f8._16_8_;
      local_f8._0_8_ = (StringTree *)0x0;
      local_f8._8_8_ = 0;
      pFVar10 = (FixedArray<char,_1UL> *)(ulong)indent;
      encodeList(&SStack_168,this,&local_a8,(bool)local_16e,indent,multiline,hasPrefix);
      local_128[0x20] = 0x7b;
      local_16f = 0x7d;
      kj::StringTree::concat<kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
                (__return_storage_ptr__,(StringTree *)(local_128 + 0x20),
                 (FixedArray<char,_1UL> *)&SStack_168,(StringTree *)&local_16f,pFVar10);
      sVar2 = SStack_168.branches.size_;
      pBVar3 = SStack_168.branches.ptr;
      if (SStack_168.branches.ptr != (Branch *)0x0) {
        SStack_168.branches.ptr = (Branch *)0x0;
        SStack_168.branches.size_ = 0;
        (**(SStack_168.branches.disposer)->_vptr_ArrayDisposer)
                  (SStack_168.branches.disposer,pBVar3,0x40,sVar2,sVar2,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
      }
      sVar2 = SStack_168.text.content.size_;
      pcVar1 = SStack_168.text.content.ptr;
      if (SStack_168.text.content.ptr != (char *)0x0) {
        SStack_168.text.content.ptr = (char *)0x0;
        SStack_168.text.content.size_ = 0;
        (**(SStack_168.text.content.disposer)->_vptr_ArrayDisposer)
                  (SStack_168.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
      }
      sVar2 = local_a8.size_;
      pSVar7 = local_a8.ptr;
      if (local_a8.ptr != (StringTree *)0x0) {
        local_a8.ptr = (StringTree *)0x0;
        local_a8.size_ = 0;
        (**(local_a8.disposer)->_vptr_ArrayDisposer)
                  (local_a8.disposer,pSVar7,0x38,sVar2,sVar2,
                   kj::ArrayDisposer::Dispose_<kj::StringTree>::destruct);
      }
      uVar5 = local_f8._8_8_;
      uVar4 = local_f8._0_8_;
      if ((StringTree *)local_f8._0_8_ != (StringTree *)0x0) {
        local_f8._0_8_ = (StringTree *)0x0;
        local_f8._8_8_ = 0;
        (***(_func_int ***)local_f8._16_8_)
                  (local_f8._16_8_,uVar4,0x38,uVar5,uVar5,
                   kj::ArrayDisposer::Dispose_<kj::StringTree>::destruct);
      }
      break;
    case 6:
      SStack_168.text.content.size_ = (size_t)value._reader.pointers;
      if (value._reader.pointerCount == 0) {
        value._reader.nestingLimit = 0x7fffffff;
        SStack_168.text.content.size_ = (size_t)(WirePointer *)0x0;
      }
      SStack_168.size_._0_4_ = 0;
      SStack_168.size_._4_4_ = 0;
      SStack_168.text.content.ptr._0_4_ = 0;
      SStack_168.text.content.ptr._4_4_ = 0;
      if (value._reader.pointerCount != 0) {
        SStack_168.size_._0_4_ = value._reader.segment._0_4_;
        SStack_168.size_._4_4_ = value._reader.segment._4_4_;
        SStack_168.text.content.ptr._0_4_ = value._reader.capTable._0_4_;
        SStack_168.text.content.ptr._4_4_ = value._reader.capTable._4_4_;
      }
      SStack_168.text.content.disposer._0_4_ = value._reader.nestingLimit;
      capnp::_::PointerReader::getStruct
                ((StructReader *)&local_68,(PointerReader *)&SStack_168,(word *)0x0);
      SStack_168.text.content.size_ = CONCAT44(local_68.step,local_68.elementCount) + 8;
      SStack_168.size_._0_4_ = (uint)local_68.segment;
      SStack_168.size_._4_4_ = local_68.segment._4_4_;
      SStack_168.text.content.ptr._0_4_ = local_68.capTable._0_4_;
      SStack_168.text.content.ptr._4_4_ = local_68.capTable._4_4_;
      SStack_168.text.content.disposer._0_4_ = local_68.nestingLimit;
      if (local_68.structPointerCount < 2) {
        SStack_168.size_._0_4_ = 0;
        SStack_168.size_._4_4_ = 0;
        SStack_168.text.content.ptr._0_4_ = 0;
        SStack_168.text.content.ptr._4_4_ = 0;
        SStack_168.text.content.size_ = 0;
        SStack_168.text.content.disposer._0_4_ = 0x7fffffff;
      }
      capnp::_::PointerReader::getList
                ((ListReader *)local_f8,(PointerReader *)&SStack_168,INLINE_COMPOSITE,(word *)0x0);
      auStack_16c = (undefined1  [4])((indent + 1) - (uint)((uint)local_f8._24_4_ < 2));
      SStack_168.text.content.size_ = (size_t)&uStack_16d;
      uStack_16d = 0;
      SStack_168.text.content.ptr = auStack_16c;
      SStack_168.size_ = (size_t)this;
      local_128._32_8_ = (Branch *)local_f8;
      kj::_::Mapper<capnp::List<capnp::json::Value,_(capnp::Kind)3>::Reader_&>::
      operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_json_c__:90:32)>
                ((Array<kj::StringTree> *)local_128,
                 (Mapper<capnp::List<capnp::json::Value,_(capnp::Kind)3>::Reader_&> *)
                 (local_128 + 0x20),(anon_class_24_3_b5b61ab8 *)&SStack_168);
      SStack_168.text.content.size_ = 0;
      iVar9 = 0x7fffffff;
      if (local_68.structPointerCount != 0) {
        SStack_168.text.content.size_ = CONCAT44(local_68.step,local_68.elementCount);
        iVar9 = local_68.nestingLimit;
      }
      SStack_168.size_._0_4_ = 0;
      SStack_168.size_._4_4_ = 0;
      SStack_168.text.content.ptr._0_4_ = 0;
      SStack_168.text.content.ptr._4_4_ = 0;
      if (local_68.structPointerCount != 0) {
        SStack_168.size_._0_4_ = (uint)local_68.segment;
        SStack_168.size_._4_4_ = local_68.segment._4_4_;
        SStack_168.text.content.ptr._0_4_ = local_68.capTable._0_4_;
        SStack_168.text.content.ptr._4_4_ = local_68.capTable._4_4_;
      }
      SStack_168.text.content.disposer =
           (ArrayDisposer *)CONCAT44(SStack_168.text.content.disposer._4_4_,iVar9);
      RVar14 = capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)&SStack_168,(void *)0x0,0);
      local_f8._48_8_ = local_128._0_8_;
      pAStack_c0 = (ArrayDisposer *)local_128._8_8_;
      pAStack_b8 = (ArrayDisposer *)local_128._16_8_;
      local_128._0_8_ = (Reader *)0x0;
      local_128._8_8_ = (char *)0x0;
      encodeList(&SStack_168,this,(Array<kj::StringTree> *)(local_f8 + 0x30),(bool)uStack_16d,indent
                 ,multiline,true);
      local_100 = RVar14.super_StringPtr.content.size_ - 1;
      local_16f = 0x28;
      local_16e = 0x29;
      local_128._32_8_ = RVar14.super_StringPtr.content.ptr;
      kj::StringTree::
      concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
                (__return_storage_ptr__,(StringTree *)(local_128 + 0x20),
                 (ArrayPtr<const_char> *)&local_16f,(FixedArray<char,_1UL> *)&SStack_168,
                 (StringTree *)&local_16e,(FixedArray<char,_1UL> *)multiline);
      sVar2 = SStack_168.branches.size_;
      pBVar3 = SStack_168.branches.ptr;
      if (SStack_168.branches.ptr != (Branch *)0x0) {
        SStack_168.branches.ptr = (Branch *)0x0;
        SStack_168.branches.size_ = 0;
        (**(SStack_168.branches.disposer)->_vptr_ArrayDisposer)
                  (SStack_168.branches.disposer,pBVar3,0x40,sVar2,sVar2,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
      }
      sVar2 = SStack_168.text.content.size_;
      pcVar1 = SStack_168.text.content.ptr;
      if (SStack_168.text.content.ptr != (char *)0x0) {
        SStack_168.text.content.ptr = (char *)0x0;
        SStack_168.text.content.size_ = 0;
        (**(SStack_168.text.content.disposer)->_vptr_ArrayDisposer)
                  (SStack_168.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
      }
      pAVar6 = pAStack_c0;
      uVar4 = local_f8._48_8_;
      if ((Reader *)local_f8._48_8_ != (Reader *)0x0) {
        local_f8._48_8_ = (Reader *)0x0;
        pAStack_c0 = (ArrayDisposer *)0x0;
        (**pAStack_b8->_vptr_ArrayDisposer)
                  (pAStack_b8,uVar4,0x38,pAVar6,pAVar6,
                   kj::ArrayDisposer::Dispose_<kj::StringTree>::destruct);
      }
      uVar5 = local_128._8_8_;
      uVar4 = local_128._0_8_;
      if ((Reader *)local_128._0_8_ != (Reader *)0x0) {
        local_128._0_8_ = (Reader *)0x0;
        local_128._8_8_ = (char *)0x0;
        (***(_func_int ***)local_128._16_8_)
                  (local_128._16_8_,uVar4,0x38,uVar5,uVar5,
                   kj::ArrayDisposer::Dispose_<kj::StringTree>::destruct);
      }
      break;
    case 7:
      bVar11 = value._reader.pointerCount == 0;
      SStack_168.text.content.size_ = (size_t)value._reader.pointers;
      if (bVar11) {
        SStack_168.text.content.size_ = (size_t)(WirePointer *)0x0;
      }
      iVar9 = 0x7fffffff;
      if (!bVar11) {
        iVar9 = value._reader.nestingLimit;
      }
      SStack_168.size_._0_4_ = 0;
      SStack_168.size_._4_4_ = 0;
      SStack_168.text.content.ptr._0_4_ = 0;
      SStack_168.text.content.ptr._4_4_ = 0;
      if (!bVar11) {
        SStack_168.size_._0_4_ = value._reader.segment._0_4_;
        SStack_168.size_._4_4_ = value._reader.segment._4_4_;
        SStack_168.text.content.ptr._0_4_ = value._reader.capTable._0_4_;
        SStack_168.text.content.ptr._4_4_ = value._reader.capTable._4_4_;
      }
      SStack_168.text.content.disposer =
           (ArrayDisposer *)CONCAT44(SStack_168.text.content.disposer._4_4_,iVar9);
      RVar14 = capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)&SStack_168,(void *)0x0,0);
      params_00 = (ArrayPtr<const_char> *)(RVar14.super_StringPtr.content.size_ - 1);
      SStack_168.text.content.ptr = (char *)params_00;
      SStack_168.size_ = (size_t)RVar14.super_StringPtr.content.ptr;
      goto LAB_002e62c7;
    default:
      local_68.segment._0_4_ = (uint)*value._reader.data;
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23],unsigned_int>
                ((Fault *)&SStack_168,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x67,FAILED,(char *)0x0,
                 "\"unknown JsonValue type\", static_cast<uint>(value.which())",
                 (char (*) [23])"unknown JsonValue type",(uint *)&local_68);
      kj::_::Debug::Fault::fatal((Fault *)&SStack_168);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree encodeRaw(JsonValue::Reader value, uint indent, bool& multiline,
                           bool hasPrefix) const {
    switch (value.which()) {
      case JsonValue::NULL_:
        return kj::strTree("null");
      case JsonValue::BOOLEAN:
        return kj::strTree(value.getBoolean());
      case JsonValue::NUMBER:
        return kj::strTree(value.getNumber());

      case JsonValue::STRING:
        return kj::strTree(encodeString(value.getString()));

      case JsonValue::ARRAY: {
        auto array = value.getArray();
        uint subIndent = indent + (array.size() > 1);
        bool childMultiline = false;
        auto encodedElements = KJ_MAP(element, array) {
          return encodeRaw(element, subIndent, childMultiline, false);
        };

        return kj::strTree('[', encodeList(
            kj::mv(encodedElements), childMultiline, indent, multiline, hasPrefix), ']');
      }

      case JsonValue::OBJECT: {
        auto object = value.getObject();
        uint subIndent = indent + (object.size() > 1);
        bool childMultiline = false;
        kj::StringPtr colon = prettyPrint ? ": " : ":";
        auto encodedElements = KJ_MAP(field, object) {
          return kj::strTree(
              encodeString(field.getName()), colon,
              encodeRaw(field.getValue(), subIndent, childMultiline, true));
        };

        return kj::strTree('{', encodeList(
            kj::mv(encodedElements), childMultiline, indent, multiline, hasPrefix), '}');
      }

      case JsonValue::CALL: {
        auto call = value.getCall();
        auto params = call.getParams();
        uint subIndent = indent + (params.size() > 1);
        bool childMultiline = false;
        auto encodedElements = KJ_MAP(element, params) {
          return encodeRaw(element, subIndent, childMultiline, false);
        };

        return kj::strTree(call.getFunction(), '(', encodeList(
            kj::mv(encodedElements), childMultiline, indent, multiline, true), ')');
      }

      case JsonValue::RAW: {
        return kj::strTree(value.getRaw());
      }
    }

    KJ_FAIL_ASSERT("unknown JsonValue type", static_cast<uint>(value.which()));
  }